

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemTooBig(Mem *p)

{
  int local_1c;
  int n;
  Mem *p_local;
  
  if ((p->flags & 0x12) == 0) {
    p_local._4_4_ = 0;
  }
  else {
    local_1c = p->n;
    if ((p->flags & 0x4000) != 0) {
      local_1c = (p->u).nZero + local_1c;
    }
    p_local._4_4_ = (uint)(p->db->aLimit[0] < local_1c);
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemTooBig(Mem *p){
  assert( p->db!=0 );
  if( p->flags & (MEM_Str|MEM_Blob) ){
    int n = p->n;
    if( p->flags & MEM_Zero ){
      n += p->u.nZero;
    }
    return n>p->db->aLimit[SQLITE_LIMIT_LENGTH];
  }
  return 0; 
}